

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O1

void __thiscall VulkanUtilities::VulkanMemoryManager::ShrinkMemory(VulkanMemoryManager *this)

{
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  _Var1;
  char acVar2 [8];
  long lVar3;
  ulong uVar4;
  int iVar5;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  __it;
  VkDeviceSize *pVVar6;
  char *Args_2;
  bool bVar7;
  MemorySizeFormatter<unsigned_long> *Args_7;
  string _msg;
  unsigned_long local_60;
  char local_58 [8];
  char local_50 [8];
  char local_48 [8];
  undefined4 local_40;
  undefined8 local_38;
  
  Args_7 = (MemorySizeFormatter<unsigned_long> *)0x29818d;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_PagesMtx);
  if (iVar5 == 0) {
    if (((this->m_DeviceLocalReserveSize < (this->m_CurrAllocatedSize)._M_elems[0]) ||
        (this->m_HostVisibleReserveSize < (this->m_CurrAllocatedSize)._M_elems[1])) &&
       (__it._M_cur = (__node_type *)(this->m_Pages)._M_h._M_before_begin._M_nxt,
       __it._M_cur != (__node_type *)0x0)) {
      do {
        _Var1._M_cur = *__it._M_cur;
        acVar2 = *(char (*) [8])((long)__it._M_cur + 0xd8);
        if (*(char (*) [8])((long)__it._M_cur + 0xe0) == acVar2) {
          lVar3 = *(long *)((long)__it._M_cur + 0x110);
          bVar7 = lVar3 != 0;
          pVVar6 = &this->m_DeviceLocalReserveSize;
          if (bVar7) {
            pVVar6 = &this->m_HostVisibleReserveSize;
          }
          uVar4 = (this->m_CurrAllocatedSize)._M_elems[bVar7];
          if (*pVVar6 < uVar4) {
            local_60 = uVar4 - (long)acVar2;
            (this->m_CurrAllocatedSize)._M_elems[bVar7] = local_60;
            Args_2 = "device-local";
            if (lVar3 != 0) {
              Args_2 = "host-visible";
            }
            local_40 = 2;
            local_38 = 0;
            local_58[0] = '\x02';
            local_58[1] = '\0';
            local_58[2] = '\0';
            local_58[3] = '\0';
            local_50[0] = '\0';
            local_50[1] = '\0';
            local_50[2] = '\0';
            local_50[3] = '\0';
            local_50[4] = '\0';
            local_50[5] = '\0';
            local_50[6] = '\0';
            local_50[7] = '\0';
            local_48 = acVar2;
            Diligent::
            FormatString<char[22],std::__cxx11::string,char[15],char[13],char[8],Diligent::MemorySizeFormatter<unsigned_long>,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
                      (&_msg,(Diligent *)"VulkanMemoryManager \'",(char (*) [22])&this->m_MgrName,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\': destroying ",(char (*) [15])Args_2,(char (*) [13])" page (",&local_48,
                       (MemorySizeFormatter<unsigned_long> *)"). Current allocated size: ",
                       (char (*) [28])&local_60,Args_7);
            if (Diligent::DebugMessageCallback != (undefined *)0x0) {
              (*(code *)Diligent::DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_msg._M_dataplus._M_p != &_msg.field_2) {
              operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
            }
            (*this->_vptr_VulkanMemoryManager[1])(this,(long)__it._M_cur + 0x18);
            Args_7 = (MemorySizeFormatter<unsigned_long> *)0x2982f8;
            std::
            _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>,_std::__detail::_Select1st,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::erase(&(this->m_Pages)._M_h,(const_iterator)__it._M_cur);
          }
        }
        __it._M_cur = _Var1._M_cur;
      } while (_Var1._M_cur != (__node_type *)0x0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_PagesMtx);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void VulkanMemoryManager::ShrinkMemory()
{
    std::lock_guard<std::mutex> Lock{m_PagesMtx};
    if (m_CurrAllocatedSize[0] <= m_DeviceLocalReserveSize && m_CurrAllocatedSize[1] <= m_HostVisibleReserveSize)
        return;

    auto it = m_Pages.begin();
    while (it != m_Pages.end())
    {
        auto curr_it = it;
        ++it;
        auto& Page          = curr_it->second;
        bool  IsHostVisible = Page.GetCPUMemory() != nullptr;
        auto  ReserveSize   = IsHostVisible ? m_HostVisibleReserveSize : m_DeviceLocalReserveSize;
        if (Page.IsEmpty() && m_CurrAllocatedSize[IsHostVisible ? 1 : 0] > ReserveSize)
        {
            auto PageSize = Page.GetPageSize();
            m_CurrAllocatedSize[IsHostVisible ? 1 : 0] -= PageSize;
            LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "': destroying ", (IsHostVisible ? "host-visible" : "device-local"),
                             " page (", Diligent::FormatMemorySize(PageSize, 2),
                             "). Current allocated size: ",
                             Diligent::FormatMemorySize(m_CurrAllocatedSize[IsHostVisible ? 1 : 0], 2));
            OnPageDestroy(Page);
            m_Pages.erase(curr_it);
        }
    }
}